

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::base64_valid(c4 *this,csubstr encoded)

{
  char cVar1;
  char c;
  iterator __end1;
  iterator __begin1;
  csubstr *__range1;
  csubstr encoded_local;
  bool local_11;
  
  if (((undefined1  [16])encoded & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
    for (__begin1 = (iterator)this; (c4 *)__begin1 != this + (long)encoded.str;
        __begin1 = __begin1 + 1) {
      cVar1 = *__begin1;
      if (cVar1 < '\0') {
        return false;
      }
      if ((cVar1 != '=') && (detail::base64_char_to_sextet_[cVar1] == -1)) {
        return false;
      }
    }
    local_11 = true;
  }
  else {
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool base64_valid(csubstr encoded)
{
    if(encoded.len % 4) return false;
    for(const char c : encoded)
    {
        if(c < 0/* || c >= 128*/)
            return false;
        if(c == '=')
            continue;
        if(detail::base64_char_to_sextet_[c] == char(-1))
            return false;
    }
    return true;
}